

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O3

void ntru_keypair_free(NTRUKeyPair *keypair)

{
  uint16_t *puVar1;
  
  puVar1 = keypair->h;
  smemclr(puVar1,(ulong)keypair->p * 2);
  safefree(puVar1);
  puVar1 = keypair->f3;
  smemclr(puVar1,(ulong)keypair->p * 2);
  safefree(puVar1);
  puVar1 = keypair->ginv;
  smemclr(puVar1,(ulong)keypair->p * 2);
  safefree(puVar1);
  puVar1 = keypair->rho;
  smemclr(puVar1,(ulong)keypair->p * 2);
  safefree(puVar1);
  safefree(keypair);
  return;
}

Assistant:

void ntru_keypair_free(NTRUKeyPair *keypair)
{
    ring_free(keypair->h, keypair->p);
    ring_free(keypair->f3, keypair->p);
    ring_free(keypair->ginv, keypair->p);
    ring_free(keypair->rho, keypair->p);
    sfree(keypair);
}